

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

String * __thiscall Path::name(String *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *ch;
  size_t secondLastSlash;
  Path *this_local;
  
  bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive);
  if (bVar1) {
    sVar2 = String::size(&this->super_String);
    sVar2 = String::lastIndexOf(&this->super_String,'/',sVar2 - 2,CaseSensitive);
    if (sVar2 == 0xffffffffffffffff) {
      String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
    }
    else {
      sVar3 = String::size(&this->super_String);
      String::mid(__return_storage_ptr__,&this->super_String,sVar2 + 1,(sVar3 - sVar2) - 2);
    }
  }
  else {
    ch = fileName(this,(size_t *)0x0);
    String::String(__return_storage_ptr__,ch,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

String Path::name() const
{
    if (endsWith('/')) {
        const size_t secondLastSlash = lastIndexOf('/', size() - 2);
        if (secondLastSlash != String::npos) {
            return mid(secondLastSlash + 1, size() - secondLastSlash - 2);
        }
        return String();
    } else {
        return fileName();
    }
}